

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_ARB1_start(Context *ctx,char *profilestr)

{
  int iVar1;
  uint uVar2;
  char *pcStack_28;
  int ver;
  char *shader_full_str;
  char *shader_str;
  char *profilestr_local;
  Context *ctx_local;
  
  iVar1 = shader_is_vertex(ctx);
  if (iVar1 == 0) {
    iVar1 = shader_is_pixel(ctx);
    if (iVar1 == 0) {
      failf(ctx,"Shader type %u unsupported in this profile.",(ulong)ctx->shader_type);
      return;
    }
    shader_full_str = "fp";
    pcStack_28 = "fragment";
  }
  else {
    shader_full_str = "vp";
    pcStack_28 = "vertex";
  }
  set_output(ctx,&ctx->preflight);
  iVar1 = strcmp(profilestr,"arb1");
  if (iVar1 == 0) {
    output_line(ctx,"!!ARB%s1.0",shader_full_str);
  }
  else {
    iVar1 = strcmp(profilestr,"nv2");
    if (iVar1 == 0) {
      ctx->profile_supports_nv2 = 1;
      output_line(ctx,"!!ARB%s1.0",shader_full_str);
      output_line(ctx,"OPTION NV_%s_program2;",pcStack_28);
    }
    else {
      iVar1 = strcmp(profilestr,"nv3");
      if (iVar1 == 0) {
        iVar1 = shader_is_pixel(ctx);
        uVar2 = 3;
        if (iVar1 != 0) {
          uVar2 = 2;
        }
        ctx->profile_supports_nv2 = 1;
        ctx->profile_supports_nv3 = 1;
        output_line(ctx,"!!ARB%s1.0",shader_full_str);
        output_line(ctx,"OPTION NV_%s_program%d;",pcStack_28,(ulong)uVar2);
      }
      else {
        iVar1 = strcmp(profilestr,"nv4");
        if (iVar1 == 0) {
          ctx->profile_supports_nv2 = 1;
          ctx->profile_supports_nv3 = 1;
          ctx->profile_supports_nv4 = 1;
          output_line(ctx,"!!NV%s4.0",shader_full_str);
        }
        else {
          failf(ctx,"Profile \'%s\' unsupported or unknown.",profilestr);
        }
      }
    }
  }
  set_output(ctx,&ctx->mainline);
  return;
}

Assistant:

static void emit_ARB1_start(Context *ctx, const char *profilestr)
{
    const char *shader_str = NULL;
    const char *shader_full_str = NULL;
    if (shader_is_vertex(ctx))
    {
        shader_str = "vp";
        shader_full_str = "vertex";
    } // if
    else if (shader_is_pixel(ctx))
    {
        shader_str = "fp";
        shader_full_str = "fragment";
    } // else if
    else
    {
        failf(ctx, "Shader type %u unsupported in this profile.",
              (uint) ctx->shader_type);
        return;
    } // if

    set_output(ctx, &ctx->preflight);

    if (strcmp(profilestr, MOJOSHADER_PROFILE_ARB1) == 0)
        output_line(ctx, "!!ARB%s1.0", shader_str);

    #if SUPPORT_PROFILE_ARB1_NV
    else if (strcmp(profilestr, MOJOSHADER_PROFILE_NV2) == 0)
    {
        ctx->profile_supports_nv2 = 1;
        output_line(ctx, "!!ARB%s1.0", shader_str);
        output_line(ctx, "OPTION NV_%s_program2;", shader_full_str);
    } // else if

    else if (strcmp(profilestr, MOJOSHADER_PROFILE_NV3) == 0)
    {
        // there's no NV_fragment_program3, so just use 2.
        const int ver = shader_is_pixel(ctx) ? 2 : 3;
        ctx->profile_supports_nv2 = 1;
        ctx->profile_supports_nv3 = 1;
        output_line(ctx, "!!ARB%s1.0", shader_str);
        output_line(ctx, "OPTION NV_%s_program%d;", shader_full_str, ver);
    } // else if

    else if (strcmp(profilestr, MOJOSHADER_PROFILE_NV4) == 0)
    {
        ctx->profile_supports_nv2 = 1;
        ctx->profile_supports_nv3 = 1;
        ctx->profile_supports_nv4 = 1;
        output_line(ctx, "!!NV%s4.0", shader_str);
    } // else if
    #endif

    else
    {
        failf(ctx, "Profile '%s' unsupported or unknown.", profilestr);
    } // else

    set_output(ctx, &ctx->mainline);
}